

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void cs::foreach_helper<std::__cxx11::string,char>
               (context_t *context,string *iterator,var *obj,
               deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body)

{
  element_type *peVar1;
  _Elt_pointer ppsVar2;
  statement_base *psVar3;
  bool bVar4;
  undefined *puVar5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  pointer dat;
  int iVar8;
  _Elt_pointer ppsVar9;
  _Elt_pointer ppsVar10;
  _Map_pointer pppsVar11;
  scope_guard scope;
  any local_c0;
  scope_guard local_b8;
  char *local_b0;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *local_a8;
  string *local_a0;
  char *local_98;
  
  local_a0 = iterator;
  pbVar7 = cs_impl::any::const_val<std::__cxx11::string>(obj);
  if (pbVar7->_M_string_length != 0) {
    peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1->break_block == true) {
      peVar1->break_block = false;
    }
    if (peVar1->continue_block == true) {
      peVar1->continue_block = false;
    }
    local_b8.context = context;
    domain_manager::add_domain(&(peVar1->super_runtime_type).storage);
    pbVar7 = cs_impl::any::const_val<std::__cxx11::string>(obj);
    local_b0 = (char *)pbVar7->_M_string_length;
    if (local_b0 != (char *)0x0) {
      dat = (pbVar7->_M_dataplus)._M_p;
      local_b0 = local_b0 + (long)dat;
      local_a8 = body;
      do {
        puVar5 = current_process;
        if ((*current_process & 1) != 0) {
          LOCK();
          *current_process = 0;
          UNLOCK();
          event_type::touch((event_type *)(puVar5 + 0xf8),(void *)0x0);
        }
        peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->instance).
                 super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        cs_impl::any::any<char>(&local_c0,dat);
        domain_manager::add_var_no_return<std::__cxx11::string_const&>
                  (&(peVar1->super_runtime_type).storage,local_a0,&local_c0);
        local_98 = dat;
        cs_impl::any::recycle(&local_c0);
        ppsVar10 = (body->
                   super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_start._M_cur;
        ppsVar2 = (body->
                  super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppsVar10 != ppsVar2) {
          ppsVar9 = (body->
                    super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                    _M_impl.super__Deque_impl_data._M_start._M_last;
          pppsVar11 = (body->
                      super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>
                      )._M_impl.super__Deque_impl_data._M_start._M_node;
          do {
            puVar5 = current_process;
            psVar3 = *ppsVar10;
            if ((*current_process & 1) != 0) {
              LOCK();
              *current_process = 0;
              UNLOCK();
              event_type::touch((event_type *)(puVar5 + 0xf8),(void *)0x0);
            }
            (*psVar3->_vptr_statement_base[3])(psVar3);
            peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->instance).
                     super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            iVar8 = 1;
            if (peVar1->return_fcall == false) {
              if (peVar1->break_block == true) {
                peVar1->break_block = false;
                goto LAB_00173240;
              }
              if (peVar1->continue_block == true) {
                peVar1->continue_block = false;
                iVar8 = 4;
                goto LAB_00173240;
              }
              iVar8 = 0;
              bVar4 = true;
            }
            else {
LAB_00173240:
              bVar4 = false;
            }
            if (!bVar4) goto LAB_00173274;
            ppsVar10 = ppsVar10 + 1;
            if (ppsVar10 == ppsVar9) {
              ppsVar10 = pppsVar11[1];
              pppsVar11 = pppsVar11 + 1;
              ppsVar9 = ppsVar10 + 0x40;
            }
          } while (ppsVar10 != ppsVar2);
        }
        iVar8 = 4;
LAB_00173274:
        pcVar6 = local_98;
        body = local_a8;
        if (iVar8 == 4) {
          iVar8 = 0;
          domain_manager::next_domain
                    (&((((((local_b8.context)->
                          super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                        ->instance).
                        super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_runtime_type).storage);
        }
      } while ((iVar8 == 0) && (dat = pcVar6 + 1, dat != local_b0));
    }
    scope_guard::~scope_guard(&local_b8);
  }
  return;
}

Assistant:

void foreach_helper(const context_t &context, const string &iterator, const var &obj,
	                    std::deque<statement_base *> &body)
	{
		if (obj.const_val<T>().empty())
			return;
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		for (const X &it: obj.const_val<T>()) {
			current_process->poll_event();
			context->instance->storage.add_var_no_return(iterator, it);
			for (auto &ptr: body) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}